

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O3

void __thiscall
solitaire::Solitaire::throwExceptionOnInvalidFoundationPileId(Solitaire *this,PileId *id)

{
  runtime_error *this_00;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (id->t < 4) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&sStack_58,id->t);
  std::operator+(&local_38,"Cannot access foundation pile with id: ",&sStack_58);
  std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Solitaire::throwExceptionOnInvalidFoundationPileId(const PileId id) const {
    if (id.t >= foundationPilesCount)
        throw std::runtime_error {
            "Cannot access foundation pile with id: " + std::to_string(id)
        };
}